

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PpScanner.cpp
# Opt level: O3

int __thiscall glslang::TPpContext::lFloatConst(TPpContext *this,int len,int ch,TPpToken *ppToken)

{
  char *__s;
  istringstream *piVar1;
  EShSource EVar2;
  TParseContextBase *pTVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  longlong lVar8;
  size_t sVar9;
  bool bVar10;
  long lVar11;
  byte bVar12;
  uint uVar13;
  char *pcVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  char cVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  double expFactor;
  double dVar24;
  undefined4 uVar26;
  undefined1 auVar25 [16];
  undefined1 auVar27 [16];
  double dVar28;
  TString numstr;
  int local_ac;
  int local_80;
  allocator<char> local_79;
  TPoolAllocator *local_78;
  char *local_70;
  long local_68;
  char local_60 [16];
  long *local_50 [2];
  long local_40 [2];
  ulong uVar7;
  
  __s = ppToken->name;
  if (len < 1) {
    uVar7 = 0;
  }
  else {
    uVar6 = 0;
    do {
      uVar7 = uVar6;
      if (__s[uVar6] != '0') break;
      uVar6 = uVar6 + 1;
      uVar7 = (ulong)(uint)len;
    } while ((uint)len != uVar6);
  }
  lVar11 = (long)len;
  uVar13 = (uint)uVar7;
  uVar5 = len;
  if ((int)uVar13 < len) {
    uVar5 = uVar13;
  }
  uVar15 = len + 1;
  lVar19 = lVar11;
  do {
    uVar16 = uVar5;
    if (lVar19 <= (int)uVar13) break;
    uVar15 = uVar15 - 1;
    lVar4 = lVar19 + -1;
    lVar19 = lVar19 + -1;
    uVar16 = uVar15;
  } while (ppToken->name[lVar4] == '0');
  local_80 = uVar16 - uVar13;
  bVar10 = local_80 < 0x10;
  if (local_80 < 0x10 && (local_80 != 0 && (int)uVar13 <= (int)uVar16)) {
    pcVar14 = ppToken->name + (uVar7 & 0xffffffff);
    lVar19 = 0;
    do {
      lVar19 = (long)*pcVar14 + lVar19 * 10 + -0x30;
      pcVar14 = pcVar14 + 1;
      uVar5 = (int)uVar7 + 1;
      uVar7 = (ulong)uVar5;
    } while ((int)uVar5 < (int)uVar16);
  }
  else {
    lVar19 = 0;
  }
  local_ac = len - uVar16;
  bVar21 = ch == 0x2e;
  uVar5 = len;
  if (bVar21) {
    if (len < 0x401) {
      len = len + 1;
      __s[lVar11] = '.';
    }
    ch = (*(this->inputStack).
           super__Vector_base<glslang::TPpContext::tInput_*,_std::allocator<glslang::TPpContext::tInput_*>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1]->_vptr_tInput[3])();
    uVar13 = len;
    if (ch != 0x23) {
joined_r0x003775da:
      while (ch == 0x30) {
        if ((int)uVar13 < 0x401) {
          lVar11 = (long)(int)uVar13;
          uVar13 = uVar13 + 1;
          __s[lVar11] = '0';
        }
        ch = (*(this->inputStack).
               super__Vector_base<glslang::TPpContext::tInput_*,_std::allocator<glslang::TPpContext::tInput_*>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1]->_vptr_tInput[3])();
      }
      uVar5 = uVar13;
      uVar15 = uVar13;
      if (ch - 0x30U < 10) {
        do {
          if ((int)uVar5 < 0x401) {
            lVar11 = (long)(int)uVar5;
            uVar5 = uVar5 + 1;
            __s[lVar11] = (char)ch;
          }
          if (ch != 0x30) {
            uVar15 = uVar5;
          }
          ch = (*(this->inputStack).
                 super__Vector_base<glslang::TPpContext::tInput_*,_std::allocator<glslang::TPpContext::tInput_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1]->_vptr_tInput[3])();
        } while (ch - 0x30U < 10);
        if ((int)uVar13 < (int)uVar15) {
          bVar23 = local_80 < 0x10;
          local_80 = local_80 + ~uVar16 + uVar15;
          bVar10 = local_80 < 0x10 && bVar23;
          if ((local_80 < 0x10 && bVar23) && ((int)uVar16 < (int)uVar15)) {
            lVar11 = (long)(int)uVar16;
            do {
              if ((long)__s[lVar11] != 0x2e) {
                lVar19 = (long)__s[lVar11] + -0x30 + lVar19 * 10;
              }
              lVar11 = lVar11 + 1;
            } while ((int)uVar15 != lVar11);
          }
          local_ac = len - uVar15;
        }
      }
      goto LAB_003776f4;
    }
    if ((0 < this->ifdepth) ||
       (((this->parseContext->super_TParseVersions).intermediate)->source == EShSourceHlsl)) {
      if (1 < len) {
        if (len == 3) {
          if (((ppToken->name[1] == '1') || (*__s == '+')) || (*__s == '-')) goto LAB_003774eb;
        }
        else if ((len == 2) && (*__s == '1')) {
LAB_003774eb:
          ch = (*(this->inputStack).
                 super__Vector_base<glslang::TPpContext::tInput_*,_std::allocator<glslang::TPpContext::tInput_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1]->_vptr_tInput[3])();
          if ((ch == 0x49) &&
             ((ch = (*(this->inputStack).
                      super__Vector_base<glslang::TPpContext::tInput_*,_std::allocator<glslang::TPpContext::tInput_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish[-1]->_vptr_tInput[3])(), ch == 0x4e
              && (ch = (*(this->inputStack).
                         super__Vector_base<glslang::TPpContext::tInput_*,_std::allocator<glslang::TPpContext::tInput_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish[-1]->_vptr_tInput[3])(),
                 ch == 0x46)))) {
            builtin_strncpy(ppToken->name + (uint)len,"INF",4);
            if (ppToken->name[0] == '-') {
              lVar8 = -0x10000000000000;
            }
            else {
              lVar8 = 0x7ff0000000000000;
            }
            (ppToken->field_3).i64val = lVar8;
            return 0x9e;
          }
          (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
                    (this->parseContext,ppToken,"expected \'INF\'");
          goto joined_r0x003775da;
        }
      }
      (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
                (this->parseContext,ppToken,"unexpected use of");
    }
    bVar21 = true;
    iVar17 = 0;
    ch = 0x23;
    bVar23 = false;
LAB_00377817:
    uVar13 = local_ac + iVar17;
    bVar22 = true;
    if (-1 < (int)uVar13) {
      bVar22 = bVar23;
    }
    uVar5 = -uVar13;
    if (0 < (int)uVar13) {
      uVar5 = uVar13;
    }
  }
  else {
LAB_003776f4:
    len = uVar5;
    iVar17 = 0;
    if ((ch & 0xffffffdfU) != 0x45) {
      bVar23 = false;
      goto LAB_00377817;
    }
    if (len < 0x401) {
      lVar11 = (long)len;
      len = len + 1;
      __s[lVar11] = (char)ch;
    }
    ch = (*(this->inputStack).
           super__Vector_base<glslang::TPpContext::tInput_*,_std::allocator<glslang::TPpContext::tInput_*>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1]->_vptr_tInput[3])();
    if ((ch == 0x2d) || (ch == 0x2b)) {
      bVar22 = ch == 0x2d;
      if (len < 0x401) {
        lVar11 = (long)len;
        len = len + 1;
        __s[lVar11] = (char)ch;
      }
      ch = (*(this->inputStack).
             super__Vector_base<glslang::TPpContext::tInput_*,_std::allocator<glslang::TPpContext::tInput_*>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]->_vptr_tInput[3])();
    }
    else {
      bVar22 = false;
    }
    uVar5 = ch - 0x30;
    if (uVar5 < 10) {
      iVar18 = 0;
      do {
        iVar17 = uVar5 + iVar18 * 10;
        if (499 < iVar18) {
          iVar17 = iVar18;
        }
        if (len < 0x401) {
          lVar11 = (long)len;
          len = len + 1;
          __s[lVar11] = (char)ch;
        }
        ch = (*(this->inputStack).
               super__Vector_base<glslang::TPpContext::tInput_*,_std::allocator<glslang::TPpContext::tInput_*>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1]->_vptr_tInput[3])();
        uVar5 = ch - 0x30;
        iVar18 = iVar17;
      } while (uVar5 < 10);
    }
    else {
      iVar17 = 0;
      (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
                (this->parseContext,ppToken,"bad character in float exponent");
    }
    bVar21 = true;
    bVar23 = bVar22;
    if (!bVar22) goto LAB_00377817;
    bVar21 = true;
    uVar5 = iVar17 - local_ac;
  }
  bVar10 = (bool)((int)uVar5 < 0x17 & bVar10);
  dVar28 = 0.0;
  if ((bVar10) && (dVar28 = 1.0, 0 < (int)uVar5)) {
    dVar24 = 10.0;
    do {
      if ((uVar5 & 1) != 0) {
        dVar28 = dVar28 * dVar24;
      }
      dVar24 = dVar24 * dVar24;
      bVar23 = 1 < uVar5;
      uVar5 = uVar5 >> 1;
    } while (bVar23);
    uVar5 = 0;
  }
  uVar13 = ch & 0xffffffdf;
  cVar20 = (char)ch;
  if (uVar13 == 0x46) {
    if ((this->ifdepth == 0) &&
       (TParseVersions::profileRequires
                  (&this->parseContext->super_TParseVersions,&ppToken->loc,8,300,(char *)0x0,
                   "floating-point suffix"), this->ifdepth == 0)) {
      if (((this->parseContext->super_TParseVersions).messages & EShMsgRelaxedErrors) ==
          EShMsgDefault) {
        TParseVersions::profileRequires
                  (&this->parseContext->super_TParseVersions,&ppToken->loc,-9,0x78,(char *)0x0,
                   "floating-point suffix");
        bVar23 = this->ifdepth != 0;
      }
      else {
        bVar23 = false;
      }
      if (!bVar21 && !bVar23) {
        (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
                  (this->parseContext,ppToken,"float literal needs a decimal point or exponent","",
                   "");
      }
    }
    if (len < 0x401) {
      lVar11 = (long)len;
      len = len + 1;
      __s[lVar11] = cVar20;
      goto LAB_00377c2d;
    }
    iVar17 = 0;
LAB_00377c51:
    bVar21 = false;
  }
  else {
    if (uVar13 == 0x48) {
      if (this->ifdepth == 0) {
        pTVar3 = this->parseContext;
        if (((pTVar3->super_TParseVersions).intermediate)->source == EShSourceGlsl) {
          (*(pTVar3->super_TParseVersions)._vptr_TParseVersions[0x12])
                    (pTVar3,ppToken,"half floating-point suffix",0);
          bVar23 = this->ifdepth != 0;
        }
        else {
          bVar23 = false;
        }
        if (!bVar21 && !bVar23) {
          (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
                    (this->parseContext,ppToken,"float literal needs a decimal point or exponent",""
                     ,"");
        }
      }
      EVar2 = ((this->parseContext->super_TParseVersions).intermediate)->source;
      if (EVar2 == EShSourceHlsl) {
        if (0x400 < len) {
LAB_00377ac8:
          iVar17 = 1;
          goto LAB_00377c51;
        }
        lVar11 = (long)len;
        len = len + 1;
        __s[lVar11] = cVar20;
LAB_00377abf:
        iVar17 = 1;
        bVar21 = false;
      }
      else {
        if (EVar2 != EShSourceGlsl) goto LAB_00377c2d;
        uVar13 = (*(this->inputStack).
                   super__Vector_base<glslang::TPpContext::tInput_*,_std::allocator<glslang::TPpContext::tInput_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish[-1]->_vptr_tInput[3])();
        if ((uVar13 & 0xffffffdf) == 0x46) {
          if (len < 0x401) {
            __s[len] = cVar20;
            if (len != 0x400) {
              __s[(long)len + 1] = (char)uVar13;
              len = len + 2;
              goto LAB_00377abf;
            }
          }
          goto LAB_00377ac8;
        }
LAB_00377b79:
        (*(this->inputStack).
          super__Vector_base<glslang::TPpContext::tInput_*,_std::allocator<glslang::TPpContext::tInput_*>_>
          ._M_impl.super__Vector_impl_data._M_finish[-1]->_vptr_tInput[4])();
        (*(this->inputStack).
          super__Vector_base<glslang::TPpContext::tInput_*,_std::allocator<glslang::TPpContext::tInput_*>_>
          ._M_impl.super__Vector_impl_data._M_finish[-1]->_vptr_tInput[4])();
        bVar21 = false;
        iVar17 = 0;
      }
    }
    else {
      if (uVar13 == 0x4c) {
        if (this->ifdepth == 0) {
          pTVar3 = this->parseContext;
          if (((pTVar3->super_TParseVersions).intermediate)->source == EShSourceGlsl) {
            (*(pTVar3->super_TParseVersions)._vptr_TParseVersions[0x11])
                      (pTVar3,ppToken,"double floating-point suffix");
            bVar23 = this->ifdepth != 0;
          }
          else {
            bVar23 = false;
          }
          if (!bVar21 && !bVar23) {
            (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
                      (this->parseContext,ppToken,"float literal needs a decimal point or exponent",
                       "","");
          }
        }
        EVar2 = ((this->parseContext->super_TParseVersions).intermediate)->source;
        if (EVar2 != EShSourceHlsl) {
          if (EVar2 == EShSourceGlsl) {
            uVar13 = (*(this->inputStack).
                       super__Vector_base<glslang::TPpContext::tInput_*,_std::allocator<glslang::TPpContext::tInput_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish[-1]->_vptr_tInput[3])();
            if ((uVar13 & 0xffffffdf) != 0x46) goto LAB_00377b79;
            if (len < 0x401) {
              __s[len] = cVar20;
              if (len != 0x400) {
                uVar15 = len + 2;
                __s[(long)len + 1] = (char)uVar13;
                goto LAB_00377bc2;
              }
            }
            goto LAB_00377bc6;
          }
          goto LAB_00377c2d;
        }
        if (0x400 < len) {
LAB_00377bc6:
          bVar21 = true;
          iVar17 = 0;
          goto LAB_00377c5e;
        }
        uVar15 = len + 1;
        __s[len] = cVar20;
LAB_00377bc2:
        bVar21 = true;
        len = uVar15;
      }
      else {
        (*(this->inputStack).
          super__Vector_base<glslang::TPpContext::tInput_*,_std::allocator<glslang::TPpContext::tInput_*>_>
          ._M_impl.super__Vector_impl_data._M_finish[-1]->_vptr_tInput[4])();
LAB_00377c2d:
        bVar21 = false;
      }
      iVar17 = 0;
    }
    if (len < 0x401) goto LAB_00377c96;
  }
LAB_00377c5e:
  (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
            (this->parseContext,ppToken,"float literal too long","","");
  len = 0x400;
LAB_00377c96:
  __s[len] = '\0';
  if (bVar10) {
    uVar26 = (undefined4)((ulong)lVar19 >> 0x20);
    if ((dVar28 != 0.0) || (NAN(dVar28))) {
      auVar27._8_4_ = uVar26;
      auVar27._0_8_ = lVar19;
      auVar27._12_4_ = 0x45300000;
      dVar24 = (auVar27._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar19) - 4503599627370496.0);
      if (bVar22) {
        (ppToken->field_3).dval = dVar24 / dVar28;
      }
      else {
        (ppToken->field_3).dval = dVar28 * dVar24;
      }
    }
    else {
      auVar25._8_4_ = uVar26;
      auVar25._0_8_ = lVar19;
      auVar25._12_4_ = 0x45300000;
      (ppToken->field_3).dval =
           (auVar25._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar19) - 4503599627370496.0);
    }
  }
  else {
    (ppToken->field_3).dval = 0.0;
    local_78 = GetThreadPoolAllocator();
    local_70 = local_60;
    sVar9 = strlen(__s);
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    _M_construct<char_const*>
              ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_78,
               __s,__s + sVar9);
    bVar12 = local_70[local_68 + -1];
    if ((bVar12 | 0x20) == 0x66) {
      local_70[local_68 + -1] = '\0';
      bVar12 = local_70[local_68 + -2];
      local_68 = local_68 + -1;
    }
    if ((bVar12 | 0x20) == 0x68) {
      local_70[local_68 + -1] = '\0';
      bVar12 = local_70[local_68 + -2];
      local_68 = local_68 + -1;
    }
    if ((bVar12 | 0x20) == 0x6c) {
      local_70[local_68 + -1] = '\0';
      local_68 = local_68 + -1;
    }
    piVar1 = &this->strtodStream;
    std::ios::clear((int)*(undefined8 *)(*(long *)&this->strtodStream + -0x18) + (int)piVar1);
    std::__cxx11::string::string<std::allocator<char>>((string *)local_50,local_70,&local_79);
    std::__cxx11::stringbuf::str((string *)&this->field_0x258);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    std::istream::_M_extract<double>((double *)piVar1);
    if (((&this->field_0x268)[*(long *)(*(long *)piVar1 + -0x18)] & 5) != 0) {
      if ((!bVar22) && (300 < (int)(uVar5 + local_80))) {
        (ppToken->field_3).i64val = 0x7ff0000000000000;
      }
      if ((bVar22) && (300 < (int)(uVar5 + local_80))) {
        (ppToken->field_3).dval = 0.0;
      }
    }
  }
  iVar18 = 0x9f;
  if (!bVar21) {
    iVar18 = iVar17 * 2 + 0x9e;
  }
  return iVar18;
}

Assistant:

int TPpContext::lFloatConst(int len, int ch, TPpToken* ppToken)
{
    const auto saveName = [&](int ch) {
        if (len <= MaxTokenLength)
            ppToken->name[len++] = static_cast<char>(ch);
    };

    // find the range of non-zero digits before the decimal point
    int startNonZero = 0;
    while (startNonZero < len && ppToken->name[startNonZero] == '0')
        ++startNonZero;
    int endNonZero = len;
    while (endNonZero > startNonZero && ppToken->name[endNonZero-1] == '0')
        --endNonZero;
    int numWholeNumberDigits = endNonZero - startNonZero;

    // accumulate the range's value
    bool fastPath = numWholeNumberDigits <= 15;  // when the number gets too complex, set to false
    unsigned long long wholeNumber = 0;
    if (fastPath) {
        for (int i = startNonZero; i < endNonZero; ++i)
            wholeNumber = wholeNumber * 10 + (ppToken->name[i] - '0');
    }
    int decimalShift = len - endNonZero;

    // Decimal point:
    bool hasDecimalOrExponent = false;
    if (ch == '.') {
        hasDecimalOrExponent = true;
        saveName(ch);
        ch = getChar();
        int firstDecimal = len;

#ifdef ENABLE_HLSL
        // 1.#INF or -1.#INF
        if (ch == '#' && (ifdepth > 0 || parseContext.intermediate.getSource() == EShSourceHlsl)) {
            if ((len <  2) ||
                (len == 2 && ppToken->name[0] != '1') ||
                (len == 3 && ppToken->name[1] != '1' && !(ppToken->name[0] == '-' || ppToken->name[0] == '+')) ||
                (len >  3))
                parseContext.ppError(ppToken->loc, "unexpected use of", "#", "");
            else {
                // we have 1.# or -1.# or +1.#, check for 'INF'
                if ((ch = getChar()) != 'I' ||
                    (ch = getChar()) != 'N' ||
                    (ch = getChar()) != 'F')
                    parseContext.ppError(ppToken->loc, "expected 'INF'", "#", "");
                else {
                    // we have [+-].#INF, and we are targeting IEEE 754, so wrap it up:
                    saveName('I');
                    saveName('N');
                    saveName('F');
                    ppToken->name[len] = '\0';
                    if (ppToken->name[0] == '-')
                        ppToken->i64val = 0xfff0000000000000; // -Infinity
                    else
                        ppToken->i64val = 0x7ff0000000000000; // +Infinity
                    return PpAtomConstFloat;
                }
            }
        }
#endif

        // Consume leading-zero digits after the decimal point
        while (ch == '0') {
            saveName(ch);
            ch = getChar();
        }
        int startNonZeroDecimal = len;
        int endNonZeroDecimal = len;

        // Consume remaining digits, up to the exponent
        while (ch >= '0' && ch <= '9') {
            saveName(ch);
            if (ch != '0')
                endNonZeroDecimal = len;
            ch = getChar();
        }

        // Compute accumulation up to the last non-zero digit
        if (endNonZeroDecimal > startNonZeroDecimal) {
            numWholeNumberDigits += endNonZeroDecimal - endNonZero - 1; // don't include the "."
            if (numWholeNumberDigits > 15)
                fastPath = false;
            if (fastPath) {
                for (int i = endNonZero; i < endNonZeroDecimal; ++i) {
                    if (ppToken->name[i] != '.')
                        wholeNumber = wholeNumber * 10 + (ppToken->name[i] - '0');
                }
            }
            decimalShift = firstDecimal - endNonZeroDecimal;
        }
    }

    // Exponent:
    bool negativeExponent = false;
    double exponentValue = 0.0;
    int exponent = 0;
    {
        if (ch == 'e' || ch == 'E') {
            hasDecimalOrExponent = true;
            saveName(ch);
            ch = getChar();
            if (ch == '+' || ch == '-') {
                negativeExponent = ch == '-';
                saveName(ch);
                ch = getChar();
            }
            if (ch >= '0' && ch <= '9') {
                while (ch >= '0' && ch <= '9') {
                    if (exponent < 500) {
                        exponent = exponent * 10 + (ch - '0');
                    }
                    saveName(ch);
                    ch = getChar();
                }
            } else {
                parseContext.ppError(ppToken->loc, "bad character in float exponent", "", "");
            }
        }

        // Compensate for location of decimal
        if (negativeExponent)
            exponent -= decimalShift;
        else {
            exponent += decimalShift;
            if (exponent < 0) {
                negativeExponent = true;
                exponent = -exponent;
            }
        }
        if (exponent > 22)
            fastPath = false;

        if (fastPath) {
            // Compute the floating-point value of the exponent
            exponentValue = 1.0;
            if (exponent > 0) {
                double expFactor = 10;
                while (exponent > 0) {
                    if (exponent & 0x1)
                        exponentValue *= expFactor;
                    expFactor *= expFactor;
                    exponent >>= 1;
                }
            }
        }
    }

    // Suffix:
    bool isDouble = false;
    bool isFloat16 = false;
    if (ch == 'l' || ch == 'L') {
        if (ifdepth == 0 && parseContext.intermediate.getSource() == EShSourceGlsl)
            parseContext.doubleCheck(ppToken->loc, "double floating-point suffix");
        if (ifdepth == 0 && !hasDecimalOrExponent)
            parseContext.ppError(ppToken->loc, "float literal needs a decimal point or exponent", "", "");
        if (parseContext.intermediate.getSource() == EShSourceGlsl) {
            int ch2 = getChar();
            if (ch2 != 'f' && ch2 != 'F') {
                ungetChar();
                ungetChar();
            } else {
                saveName(ch);
                saveName(ch2);
                isDouble = true;
            }
        } else if (parseContext.intermediate.getSource() == EShSourceHlsl) {
            saveName(ch);
            isDouble = true;
        }
    } else if (ch == 'h' || ch == 'H') {
        if (ifdepth == 0 && parseContext.intermediate.getSource() == EShSourceGlsl)
            parseContext.float16Check(ppToken->loc, "half floating-point suffix");
        if (ifdepth == 0 && !hasDecimalOrExponent)
            parseContext.ppError(ppToken->loc, "float literal needs a decimal point or exponent", "", "");
        if (parseContext.intermediate.getSource() == EShSourceGlsl) {
            int ch2 = getChar();
            if (ch2 != 'f' && ch2 != 'F') {
                ungetChar();
                ungetChar();
            } else {
                saveName(ch);
                saveName(ch2);
                isFloat16 = true;
            }
        } else if (parseContext.intermediate.getSource() == EShSourceHlsl) {
            saveName(ch);
            isFloat16 = true;
        }
    } else
    if (ch == 'f' || ch == 'F') {
        if (ifdepth == 0)
            parseContext.profileRequires(ppToken->loc,  EEsProfile, 300, nullptr, "floating-point suffix");
        if (ifdepth == 0 && !parseContext.relaxedErrors())
            parseContext.profileRequires(ppToken->loc, ~EEsProfile, 120, nullptr, "floating-point suffix");
        if (ifdepth == 0 && !hasDecimalOrExponent)
            parseContext.ppError(ppToken->loc, "float literal needs a decimal point or exponent", "", "");
        saveName(ch);
    } else
        ungetChar();

    // Patch up the name and length for overflow

    if (len > MaxTokenLength) {
        len = MaxTokenLength;
        parseContext.ppError(ppToken->loc, "float literal too long", "", "");
    }
    ppToken->name[len] = '\0';

    // Compute the numerical value
    if (fastPath) {
        // compute the floating-point value of the exponent
        if (exponentValue == 0.0)
            ppToken->dval = (double)wholeNumber;
        else if (negativeExponent)
            ppToken->dval = (double)wholeNumber / exponentValue;
        else
            ppToken->dval = (double)wholeNumber * exponentValue;
    } else {
        // slow path
        ppToken->dval = 0.0;

        // remove suffix
        TString numstr(ppToken->name);
        if (numstr.back() == 'f' || numstr.back() == 'F')
            numstr.pop_back();
        if (numstr.back() == 'h' || numstr.back() == 'H')
            numstr.pop_back();
        if (numstr.back() == 'l' || numstr.back() == 'L')
            numstr.pop_back();

        // use platform library
        strtodStream.clear();
        strtodStream.str(numstr.c_str());
        strtodStream >> ppToken->dval;
        if (strtodStream.fail()) {
            // Assume failure combined with a large exponent was overflow, in
            // an attempt to set INF.
            if (!negativeExponent && exponent + numWholeNumberDigits > 300)
                ppToken->i64val = 0x7ff0000000000000; // +Infinity
            // Assume failure combined with a small exponent was overflow.
            if (negativeExponent && exponent + numWholeNumberDigits > 300)
                ppToken->dval = 0.0;
            // Unknown reason for failure. Theory is that either
            //  - the 0.0 is still there, or
            //  - something reasonable was written that is better than 0.0
        }
    }

    // Return the right token type
    if (isDouble)
        return PpAtomConstDouble;
    else if (isFloat16)
        return PpAtomConstFloat16;
    else
        return PpAtomConstFloat;
}